

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void filename_check(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *names,char *aname)

{
  int iVar1;
  invalid_argument *this;
  ulong uVar2;
  allocator<char> local_41;
  string bname;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&bname,aname,&local_41);
  uVar2 = 0xffffffffffffffff;
  do {
    uVar2 = uVar2 + 1;
    if ((ulong)((long)(names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar2) {
      std::__cxx11::string::~string((string *)&bname);
      return;
    }
    iVar1 = std::__cxx11::string::compare((string *)&bname);
  } while (iVar1 != 0);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"input and output file names cannot be the same");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
filename_check (vector<string> names, const char* aname)
{
    string bname (aname);
    for (size_t i = 0; i < names.size (); i++)
        if (bname.compare (names[i]) == 0)
            throw invalid_argument (
                "input and output file names cannot be the same");
}